

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmConditional(ExpressionContext *ctx,VmModule *module,ExprConditional *node)

{
  SynBase *source;
  TypeBase *structType;
  VmValue *pVVar1;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmInstruction *valueA;
  VmConstant *pVVar2;
  VmInstruction *pVVar3;
  uint in_R9D;
  VmInstruction *pVVar4;
  
  pVVar1 = CompileVm(ctx,module,node->condition);
  block = anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"if_true");
  block_00 = anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"if_false");
  block_01 = anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"if_exit");
  anon_unknown.dwarf_f89de::CreateJumpNotZero
            (module,(node->super_ExprBase).source,pVVar1,&block->super_VmValue,
             &block_00->super_VmValue);
  if (node->trueBlock->type != node->falseBlock->type) {
    __assert_fail("node->trueBlock->type == node->falseBlock->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbf4,
                  "VmValue *CompileVmConditional(ExpressionContext &, VmModule *, ExprConditional *)"
                 );
  }
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  valueA = (VmInstruction *)CompileVm(ctx,module,node->trueBlock);
  if (valueA == (VmInstruction *)0x0) {
    valueA = (VmInstruction *)0x0;
  }
  else if ((valueA->super_VmValue).typeID == 1) {
    source = (node->super_ExprBase).source;
    if ((valueA->super_VmValue).type.type == VM_TYPE_STRUCT) {
      pVVar2 = anon_unknown.dwarf_f89de::CreateAlloca
                         (ctx,module,source,node->trueBlock->type,"cond",true);
      pVVar3 = valueA;
      anon_unknown.dwarf_f89de::CreateStore
                (ctx,module,(node->super_ExprBase).source,node->trueBlock->type,
                 &pVVar2->super_VmValue,(VmValue *)valueA,0);
      in_R9D = (uint)pVVar3;
      goto LAB_0018996a;
    }
    valueA = (VmInstruction *)
             anon_unknown.dwarf_f89de::CreateLoadImmediate(module,source,(VmConstant *)valueA);
  }
  pVVar2 = (VmConstant *)0x0;
LAB_0018996a:
  anon_unknown.dwarf_f89de::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  pVVar3 = (VmInstruction *)CompileVm(ctx,module,node->falseBlock);
  if (pVVar3 == (VmInstruction *)0x0) {
    pVVar3 = (VmInstruction *)0x0;
  }
  else if ((pVVar3->super_VmValue).typeID == 1) {
    if ((pVVar3->super_VmValue).type.type == VM_TYPE_STRUCT) {
      if (pVVar2 == (VmConstant *)0x0) {
        __assert_fail("tempAddress",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xc16,
                      "VmValue *CompileVmConditional(ExpressionContext &, VmModule *, ExprConditional *)"
                     );
      }
      pVVar4 = pVVar3;
      anon_unknown.dwarf_f89de::CreateStore
                (ctx,module,(node->super_ExprBase).source,node->falseBlock->type,
                 &pVVar2->super_VmValue,(VmValue *)pVVar3,0);
      in_R9D = (uint)pVVar4;
    }
    else {
      pVVar3 = (VmInstruction *)
               anon_unknown.dwarf_f89de::CreateLoadImmediate
                         (module,(node->super_ExprBase).source,(VmConstant *)pVVar3);
    }
  }
  anon_unknown.dwarf_f89de::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  if (pVVar2 == (VmConstant *)0x0) {
    structType = (node->super_ExprBase).type;
    if (structType->size == 0) {
      pVVar2 = CreateConstantStruct
                         (ctx->allocator,(node->super_ExprBase).source,(char *)0x0,0,structType);
      return &pVVar2->super_VmValue;
    }
    if ((valueA == (VmInstruction *)0x0) || ((valueA->super_VmValue).typeID != 2)) {
      valueA = (VmInstruction *)0x0;
    }
    if ((pVVar3 == (VmInstruction *)0x0) || ((pVVar3->super_VmValue).typeID != 2)) {
      pVVar3 = (VmInstruction *)0x0;
    }
    pVVar1 = anon_unknown.dwarf_f89de::CreatePhi(module,(node->super_ExprBase).source,valueA,pVVar3)
    ;
  }
  else {
    pVVar1 = anon_unknown.dwarf_f89de::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,node->falseBlock->type,
                        &pVVar2->super_VmValue,in_R9D);
  }
  anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmConditional(ExpressionContext &ctx, VmModule *module, ExprConditional *node)
{
	VmValue* condition = CompileVm(ctx, module, node->condition);

	VmBlock *trueBlock = CreateBlock(module, node->source, "if_true");
	VmBlock *falseBlock = CreateBlock(module, node->source, "if_false");
	VmBlock *exitBlock = CreateBlock(module, node->source, "if_exit");

	CreateJumpNotZero(module, node->source, condition, trueBlock, falseBlock);

	assert(node->trueBlock->type == node->falseBlock->type);

	module->currentFunction->AddBlock(trueBlock);
	module->currentBlock = trueBlock;

	VmConstant *tempAddress = NULL;

	VmValue *trueValue = CompileVm(ctx, module, node->trueBlock);

	if(VmConstant *constant = getType<VmConstant>(trueValue))
	{
		if(constant->type.type == VM_TYPE_STRUCT)
		{
			tempAddress = CreateAlloca(ctx, module, node->source, node->trueBlock->type, "cond", true);

			CreateStore(ctx, module, node->source, node->trueBlock->type, tempAddress, constant, 0);
		}
		else
		{
			trueValue = CreateLoadImmediate(module, node->source, constant);
		}
	}

	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(falseBlock);
	module->currentBlock = falseBlock;

	VmValue *falseValue = CompileVm(ctx, module, node->falseBlock);

	if(VmConstant *constant = getType<VmConstant>(falseValue))
	{
		if(constant->type.type == VM_TYPE_STRUCT)
		{
			assert(tempAddress);

			CreateStore(ctx, module, node->source, node->falseBlock->type, tempAddress, constant, 0);
		}
		else
		{
			falseValue = CreateLoadImmediate(module, node->source, constant);
		}
	}

	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	if(tempAddress)
		return CheckType(ctx, node, CreateLoad(ctx, module, node->source, node->falseBlock->type, tempAddress, 0));

	if(node->type->size == 0)
		return CreateConstantStruct(ctx.allocator, node->source, NULL, 0, node->type);

	VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

	return CheckType(ctx, node, phi);
}